

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue_basic_tests.cpp
# Opt level: O2

void density_tests::
     dynamic_push_3<density_tests::Derived1,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
               (heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                *i_queue)

{
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  Derived1 move_source;
  Derived1 copy_source;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  local_a0;
  Derived1 local_98;
  Derived1 local_58;
  
  local_a0.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::Derived1>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push(i_queue,&local_a0);
  Derived1::Derived1(&local_58);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_copy(i_queue,&local_a0,&local_58);
  Derived1::Derived1(&local_98);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_move(i_queue,&local_a0,&local_98);
  Derived1::~Derived1(&local_98);
  Derived1::~Derived1(&local_58);
  return;
}

Assistant:

void dynamic_push_3(QUEUE & i_queue)
    {
        auto const type = QUEUE::runtime_type::template make<ELEMENT>();

        i_queue.dyn_push(type);

        ELEMENT copy_source;
        i_queue.dyn_push_copy(type, &copy_source);

        ELEMENT move_source;
        i_queue.dyn_push_move(type, &move_source);
    }